

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void linsolve(double *vec,double *mat,int16_t n)

{
  uint uVar1;
  short sVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined2 in_register_00000012;
  ulong uVar7;
  long lVar8;
  short sVar9;
  long lVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  short sVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  int local_64;
  int local_60;
  int local_5c;
  short local_40;
  long local_38;
  
  lVar6 = (long)CONCAT22(in_register_00000012,n);
  iVar4 = CONCAT22(in_register_00000012,n) + -1;
  iVar5 = CONCAT22(in_register_00000012,n) + 1;
  iVar16 = 1;
  iVar13 = 0;
  local_5c = CONCAT22(in_register_00000012,n);
  local_64 = 0;
  sVar9 = 1;
  local_60 = iVar5;
  local_38 = lVar6;
  for (uVar7 = 0; uVar17 = uVar7 & 0xffff, (int)uVar17 < iVar4; uVar7 = (ulong)((int)uVar7 + 1)) {
    sVar2 = (short)uVar7;
    sVar11 = sVar2 * n + sVar2;
    dVar23 = mat[sVar11];
    dVar22 = ABS(dVar23);
    lVar10 = (long)sVar9;
    uVar19 = uVar7;
    iVar20 = iVar16;
    for (lVar14 = lVar10; lVar14 < lVar6; lVar14 = lVar14 + 1) {
      dVar3 = ABS(mat[(short)iVar20]);
      uVar1 = (uint)lVar14;
      if (ABS(mat[(short)iVar20]) <= dVar22) {
        dVar3 = dVar22;
        uVar1 = (uint)uVar19;
      }
      dVar22 = dVar3;
      iVar20 = iVar20 + 1;
      uVar19 = (ulong)uVar1;
    }
    sVar18 = (short)uVar19;
    if (sVar18 != sVar2) {
      dVar23 = vec[uVar17];
      vec[uVar17] = vec[sVar18];
      vec[sVar18] = dVar23;
      iVar12 = iVar13 + (uint)uVar19;
      lVar14 = local_38;
      iVar20 = local_64;
      while (bVar21 = lVar14 != 0, lVar14 = lVar14 + -1, bVar21) {
        dVar23 = mat[(short)iVar20];
        mat[(short)iVar20] = mat[(short)iVar12];
        mat[(short)iVar12] = dVar23;
        iVar20 = iVar20 + CONCAT22(in_register_00000012,n);
        iVar12 = iVar12 + CONCAT22(in_register_00000012,n);
      }
      dVar23 = mat[sVar11];
    }
    iVar20 = local_60;
    for (lVar14 = lVar10; lVar14 < lVar6; lVar14 = lVar14 + 1) {
      sVar11 = sVar2 * n + (short)lVar14;
      mat[sVar11] = mat[sVar11] * (1.0 / dVar23);
      iVar15 = local_5c;
      iVar12 = iVar20;
      for (lVar8 = lVar10; lVar8 < lVar6; lVar8 = lVar8 + 1) {
        mat[(short)iVar12] = mat[(short)iVar12] - mat[sVar11] * mat[(short)iVar15];
        iVar15 = iVar15 + CONCAT22(in_register_00000012,n);
        iVar12 = iVar12 + CONCAT22(in_register_00000012,n);
      }
      vec[lVar14] = vec[lVar14] - mat[sVar11] * vec[uVar17];
      iVar20 = iVar20 + 1;
    }
    sVar9 = sVar9 + 1;
    iVar16 = iVar16 + iVar5;
    local_38 = local_38 + -1;
    local_64 = local_64 + iVar5;
    iVar13 = iVar13 + CONCAT22(in_register_00000012,n);
    local_5c = local_5c + iVar5;
    local_60 = local_60 + iVar5;
  }
  local_40 = (short)iVar4;
  sVar9 = n * n;
  for (lVar6 = (long)local_40; sVar9 = sVar9 + -1, lVar14 = (long)local_40, sVar2 = sVar9,
      -1 < lVar6; lVar6 = lVar6 + -1) {
    for (; lVar6 < lVar14; lVar14 = lVar14 + -1) {
      vec[lVar6] = vec[lVar6] - mat[sVar2] * vec[lVar14];
      sVar2 = sVar2 - n;
    }
    vec[lVar6] = vec[lVar6] / mat[(short)((n + 1) * (short)lVar6)];
  }
  return;
}

Assistant:

inline void linsolve(double* vec, double* mat, const int16_t n) {
  int16_t i, j, k, idx1, idx2, idx3;
  int16_t row_max_i;
  double row_max_val, buf;

  for (k = 0; k < n - 1; k++) {
    // Find i such that maximize A[i][k]
    idx1 = n * k + k;

    row_max_i = k;
    row_max_val = fabs(mat[idx1]);
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      if (row_max_val < fabs(mat[idx1])) {
        row_max_val = fabs(mat[idx1]);
        row_max_i = i;
      }
    }

    // Swap rows
    if (row_max_i != k) {
      buf = vec[k];
      vec[k] = vec[row_max_i];
      vec[row_max_i] = buf;
      for (j = k; j < n; j++) {
        idx1 = n * j + k;
        idx2 = n * j + row_max_i;
        buf = mat[idx1];
        mat[idx1] = mat[idx2];
        mat[idx2] = buf;
      }
    }

    // Forward elimination
    idx1 = n * k + k;
    buf = 1.0 / mat[idx1];
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      mat[idx1] = mat[idx1] * buf;

      for (j = k + 1; j < n; j++) {
        idx2 = n * j + k;
        idx3 = n * j + i;
        mat[idx3] -= mat[idx1] * mat[idx2];
      }
      vec[i] -= mat[idx1] * vec[k];
    }
  }

  // Backward elimination
  for (i = n - 1; i >= 0; i--) {
    for (j = n - 1; j > i; j--) {
      idx1 = n * j + i;
      vec[i] -= mat[idx1] * vec[j];
    }
    idx1 = n * i + i;
    vec[i] /= mat[idx1];
  }
}